

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsCreateCustomExternalObject
          (void *data,size_t inlineSlotSize,JsTraceCallback traceCallback,
          JsFinalizeCallback finalizeCallback,JsGetterSetterInterceptor **getterSetterInterceptor,
          JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *pRVar6;
  CustomExternalWrapperObject *pCVar7;
  undefined4 *puVar8;
  AutoNestedHandledExceptionType local_98 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_58 [8];
  TTDRecorder _actionEntryPopper;
  JsGetterSetterInterceptor *local_40;
  ScriptContext *local_38;
  
  auStack_58 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,false,false);
  if (JVar4 != JsNoError) goto LAB_003c7f5d;
  pSVar1 = (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
           ptr;
  local_38 = pSVar1;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_98,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (pSVar1->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (local_38->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_58,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    JVar4 = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar6 = (RecyclableObject *)0x0;
    }
    else {
      BVar5 = Js::JavascriptOperators::IsObjectOrNull(prototype);
      if (BVar5 == 0) {
        JVar4 = JsErrorArgumentNotObject;
        goto LAB_003c7ede;
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != local_38) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != local_38->threadContext) goto LAB_003c7ede;
        prototype = Js::CrossSite::MarshalVar(local_38,pRVar6,false);
      }
      pRVar6 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    JVar4 = JsErrorInvalidArgument;
    if (inlineSlotSize >> 0x20 == 0) {
      local_40 = (JsGetterSetterInterceptor *)0x0;
      pCVar7 = Js::CustomExternalWrapperObject::Create
                         (data,(uint)inlineSlotSize,traceCallback,finalizeCallback,&local_40,pRVar6,
                          local_38);
      *object = pCVar7;
      if (local_40 == (JsGetterSetterInterceptor *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                           ,0x2ba,"(interceptor)","interceptor");
        if (!bVar3) goto LAB_003c821a;
        *puVar8 = 0;
      }
      *getterSetterInterceptor = (JsGetterSetterInterceptor *)local_40;
      if (local_38->TTDShouldPerformRecordAction == true) {
        if (_actionEntryPopper.m_actionEvent == (EventLogEntry *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JsValueRef *)_actionEntryPopper.m_actionEvent = *object;
      }
      JVar4 = JsNoError;
    }
  }
LAB_003c7ede:
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x11f,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
LAB_003c821a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_98);
LAB_003c7f5d:
  if (auStack_58 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_58 + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)((long)auStack_58 + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsCreateCustomExternalObject(
    _In_opt_ void *data,
    _In_opt_ size_t inlineSlotSize,
    _In_opt_ JsTraceCallback traceCallback,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _Inout_opt_ JsGetterSetterInterceptor ** getterSetterInterceptor,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef * object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT_OR_NULL(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }
        if (inlineSlotSize > UINT32_MAX)
        {
            return JsErrorInvalidArgument;
        }

        Js::JsGetterSetterInterceptor * interceptor = nullptr;
        *object = Js::CustomExternalWrapperObject::Create(data, (uint)inlineSlotSize, traceCallback, finalizeCallback, &interceptor, prototypeObject, scriptContext);
        Assert(interceptor);
        *getterSetterInterceptor = reinterpret_cast<JsGetterSetterInterceptor*>(interceptor);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}